

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# at_application.h
# Opt level: O2

void __thiscall MessageCracker::process(MessageCracker *this,Message *message,SessionID *sessionID)

{
  bool bVar1;
  iterator iVar2;
  ClOrdID clOrdID;
  PossResend possResend;
  pair<FIX::ClOrdID,_FIX::SessionID> pair;
  Message echo;
  FieldBase FStack_3f8;
  FieldBase local_398;
  pair<FIX::ClOrdID,_FIX::SessionID> local_338;
  Message local_170 [344];
  
  FIX::Message::Message(local_170,message);
  local_338.first.super_StringField.super_FieldBase._vptr_FieldBase._0_1_ = 0;
  FIX::PossResend::PossResend((PossResend *)&local_398,(BOOLEAN *)&local_338);
  FIX::FieldMap::getFieldIfSet((FieldMap *)(message + 0x70),&local_398);
  FIX::ClOrdID::ClOrdID((ClOrdID *)&FStack_3f8);
  FIX::FieldMap::getField((FieldMap *)message,&FStack_3f8);
  std::pair<FIX::ClOrdID,_FIX::SessionID>::pair<FIX::ClOrdID_&,_true>
            (&local_338,(ClOrdID *)&FStack_3f8,sessionID);
  bVar1 = FIX::BoolField::getValue((BoolField *)&local_398);
  if (bVar1) {
    iVar2 = std::
            _Rb_tree<std::pair<FIX::ClOrdID,_FIX::SessionID>,_std::pair<FIX::ClOrdID,_FIX::SessionID>,_std::_Identity<std::pair<FIX::ClOrdID,_FIX::SessionID>_>,_std::less<std::pair<FIX::ClOrdID,_FIX::SessionID>_>,_std::allocator<std::pair<FIX::ClOrdID,_FIX::SessionID>_>_>
            ::find(&(this->m_orderIDs)._M_t,&local_338);
    if ((_Rb_tree_header *)iVar2._M_node != &(this->m_orderIDs)._M_t._M_impl.super__Rb_tree_header)
    goto LAB_0014a54f;
  }
  std::
  _Rb_tree<std::pair<FIX::ClOrdID,FIX::SessionID>,std::pair<FIX::ClOrdID,FIX::SessionID>,std::_Identity<std::pair<FIX::ClOrdID,FIX::SessionID>>,std::less<std::pair<FIX::ClOrdID,FIX::SessionID>>,std::allocator<std::pair<FIX::ClOrdID,FIX::SessionID>>>
  ::_M_insert_unique<std::pair<FIX::ClOrdID,FIX::SessionID>const&>
            ((_Rb_tree<std::pair<FIX::ClOrdID,FIX::SessionID>,std::pair<FIX::ClOrdID,FIX::SessionID>,std::_Identity<std::pair<FIX::ClOrdID,FIX::SessionID>>,std::less<std::pair<FIX::ClOrdID,FIX::SessionID>>,std::allocator<std::pair<FIX::ClOrdID,FIX::SessionID>>>
              *)&this->m_orderIDs,&local_338);
  FIX::Session::sendToTarget(local_170,sessionID);
LAB_0014a54f:
  std::pair<FIX::ClOrdID,_FIX::SessionID>::~pair(&local_338);
  FIX::FieldBase::~FieldBase(&FStack_3f8);
  FIX::FieldBase::~FieldBase(&local_398);
  FIX::Message::~Message(local_170);
  return;
}

Assistant:

void process( const FIX::Message& message, const FIX::SessionID& sessionID )
  {
    FIX::Message echo = message;
    FIX::PossResend possResend( false );
    message.getHeader().getFieldIfSet( possResend );

    FIX::ClOrdID clOrdID;
    message.getField( clOrdID );

    std::pair < FIX::ClOrdID, FIX::SessionID > pair =
      std::make_pair( clOrdID, sessionID );

    if ( possResend == true )
    {
      if ( m_orderIDs.find( pair ) != m_orderIDs.end() )
        return ;
    }
    m_orderIDs.insert( pair );
    FIX::Session::sendToTarget( echo, sessionID );
  }